

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

ssize_t __thiscall
kj::anon_unknown_36::WebSocketPipeImpl::BlockedReceive::send
          (BlockedReceive *this,int __fd,void *__buf,size_t __n,int __flags)

{
  _func_int **pp_Var1;
  bool bVar2;
  ArrayPtr<const_char> *params;
  undefined4 in_register_00000034;
  WebSocket *obj;
  String local_88;
  OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close> local_70;
  Fault local_38;
  Fault f;
  DebugExpression<bool> _kjCondition;
  BlockedReceive *this_local;
  ArrayPtr<const_char> message_local;
  
  obj = (WebSocket *)CONCAT44(in_register_00000034,__fd);
  this_local = (BlockedReceive *)__buf;
  message_local.ptr = (char *)__n;
  message_local.size_ = (size_t)this;
  f.exception._6_1_ = Canceler::isEmpty((Canceler *)(obj + 4));
  f.exception._7_1_ =
       kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(bool *)((long)&f.exception + 6));
  bVar2 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)((long)&f.exception + 7))
  ;
  if (!bVar2) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[16]>
              (&local_38,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
               ,0x106c,FAILED,"canceler.isEmpty()","_kjCondition,\"already pumping\"",
               (DebugExpression<bool> *)((long)&f.exception + 7),(char (*) [16])"already pumping");
    kj::_::Debug::Fault::fatal(&local_38);
  }
  pp_Var1 = obj[1]._vptr_WebSocket;
  str<kj::ArrayPtr<char_const>&>(&local_88,(kj *)&this_local,params);
  OneOf<kj::String,kj::Array<unsigned_char>,kj::WebSocket::Close>::OneOf<kj::String,int>
            ((OneOf<kj::String,kj::Array<unsigned_char>,kj::WebSocket::Close> *)&local_70,&local_88)
  ;
  (**(code **)(*pp_Var1 + 0x10))(pp_Var1,&local_70);
  OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>::~OneOf(&local_70);
  String::~String(&local_88);
  endState((WebSocketPipeImpl *)obj[2]._vptr_WebSocket,obj);
  kj::_::ReadyNow::operator_cast_to_Promise((ReadyNow *)this);
  return (ssize_t)this;
}

Assistant:

kj::Promise<void> send(kj::ArrayPtr<const char> message) override {
      KJ_REQUIRE(canceler.isEmpty(), "already pumping");
      fulfiller.fulfill(Message(kj::str(message)));
      pipe.endState(*this);
      return kj::READY_NOW;
    }